

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::base::utils::File::buildStrippedFilename(char *filename,char *buff,size_t limit)

{
  size_t sVar1;
  ulong in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t sizeOfFilename;
  char *local_8;
  
  sVar1 = strlen(in_RDI);
  local_8 = in_RDI;
  if (((in_RDX <= sVar1) && (local_8 = in_RDI + (sVar1 - in_RDX), *local_8 != '.')) &&
     (local_8[1] != '.')) {
    local_8 = local_8 + 3;
    strcat(in_RSI,"..");
  }
  strcat(in_RSI,local_8);
  return;
}

Assistant:

void File::buildStrippedFilename(const char* filename, char buff[], std::size_t limit) {
  std::size_t sizeOfFilename = strlen(filename);
  if (sizeOfFilename >= limit) {
    filename += (sizeOfFilename - limit);
    if (filename[0] != '.' && filename[1] != '.') {  // prepend if not already
      filename += 3;  // 3 = '..'
      STRCAT(buff, "..", limit);
    }
  }
  STRCAT(buff, filename, limit);
}